

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::memLittle16_func(void *data,uint32 size)

{
  uint uVar1;
  uint16 *words;
  
  if (1 < size) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while (size >> 1 != uVar1);
  }
  return;
}

Assistant:

void
memLittle16_func(void *data, uint32 size)
{
	uint16 w;
	uint8 *bytes = (uint8*)data;
	uint16 *words = (uint16*)data;
	size >>= 1;
	while(size--){
		w = *words++;
		*bytes++ = (uint8)w;
		*bytes++ = w >> 8;
	}
}